

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SetColumnWidth(int column_index,float width)

{
  ImGuiColumns *pIVar1;
  ImGuiWindow *pIVar2;
  float fVar3;
  ImGuiColumns *columns;
  ImGuiWindow *window;
  float width_local;
  int column_index_local;
  
  pIVar2 = GetCurrentWindowRead();
  pIVar1 = (pIVar2->DC).CurrentColumns;
  if (pIVar1 != (ImGuiColumns *)0x0) {
    window._4_4_ = column_index;
    if (column_index < 0) {
      window._4_4_ = pIVar1->Current;
    }
    fVar3 = GetColumnOffset(window._4_4_);
    SetColumnOffset(window._4_4_ + 1,fVar3 + width);
    return;
  }
  __assert_fail("columns != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                ,0x1e1b,"void ImGui::SetColumnWidth(int, float)");
}

Assistant:

void ImGui::SetColumnWidth(int column_index, float width)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    SetColumnOffset(column_index + 1, GetColumnOffset(column_index) + width);
}